

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * Matrix4f::rotation(Matrix4f *__return_storage_ptr__,Quat4f *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Quat4f qq;
  Quat4f local_20;
  
  Quat4f::normalized(&local_20);
  fVar1 = Quat4f::x(&local_20);
  fVar2 = Quat4f::x(&local_20);
  fVar3 = Quat4f::y(&local_20);
  fVar4 = Quat4f::y(&local_20);
  fVar5 = Quat4f::z(&local_20);
  fVar6 = Quat4f::z(&local_20);
  fVar7 = Quat4f::x(&local_20);
  fVar8 = Quat4f::y(&local_20);
  fVar9 = Quat4f::z(&local_20);
  fVar10 = Quat4f::w(&local_20);
  fVar11 = Quat4f::x(&local_20);
  fVar12 = Quat4f::z(&local_20);
  fVar13 = Quat4f::y(&local_20);
  fVar14 = Quat4f::w(&local_20);
  fVar15 = Quat4f::y(&local_20);
  fVar16 = Quat4f::z(&local_20);
  fVar17 = Quat4f::x(&local_20);
  fVar18 = Quat4f::w(&local_20);
  fVar19 = fVar4 * fVar3 + fVar6 * fVar5;
  fVar21 = fVar8 * fVar7 - fVar10 * fVar9;
  fVar20 = fVar12 * fVar11 + fVar14 * fVar13;
  fVar7 = fVar10 * fVar9 + fVar8 * fVar7;
  fVar6 = fVar6 * fVar5 + fVar2 * fVar1;
  fVar8 = fVar16 * fVar15 - fVar18 * fVar17;
  fVar9 = fVar12 * fVar11 - fVar14 * fVar13;
  fVar5 = fVar18 * fVar17 + fVar16 * fVar15;
  __return_storage_ptr__->m_elements[0] = 1.0 - (fVar19 + fVar19);
  __return_storage_ptr__->m_elements[1] = fVar7 + fVar7;
  __return_storage_ptr__->m_elements[2] = fVar9 + fVar9;
  __return_storage_ptr__->m_elements[3] = 0.0;
  fVar1 = fVar4 * fVar3 + fVar2 * fVar1;
  __return_storage_ptr__->m_elements[4] = fVar21 + fVar21;
  __return_storage_ptr__->m_elements[5] = 1.0 - (fVar6 + fVar6);
  __return_storage_ptr__->m_elements[6] = fVar5 + fVar5;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = fVar20 + fVar20;
  __return_storage_ptr__->m_elements[9] = fVar8 + fVar8;
  __return_storage_ptr__->m_elements[10] = 1.0 - (fVar1 + fVar1);
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotation( const Quat4f& q )
{
	Quat4f qq = q.normalized();

	float xx = qq.x() * qq.x();
	float yy = qq.y() * qq.y();
	float zz = qq.z() * qq.z();

	float xy = qq.x() * qq.y();
	float zw = qq.z() * qq.w();

	float xz = qq.x() * qq.z();
	float yw = qq.y() * qq.w();

	float yz = qq.y() * qq.z();
	float xw = qq.x() * qq.w();

	return Matrix4f
	(
		1.0f - 2.0f * ( yy + zz ),		2.0f * ( xy - zw ),				2.0f * ( xz + yw ),				0.0f,
		2.0f * ( xy + zw ),				1.0f - 2.0f * ( xx + zz ),		2.0f * ( yz - xw ),				0.0f,
		2.0f * ( xz - yw ),				2.0f * ( yz + xw ),				1.0f - 2.0f * ( xx + yy ),		0.0f,
		0.0f,							0.0f,							0.0f,							1.0f
	);
}